

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall llvm::detail::IEEEFloat::mod(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  opStatus oVar2;
  opStatus oVar3;
  cmpResult cVar4;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  IEEEFloat V;
  IEEEFloat local_90;
  IEEEFloat local_78;
  IEEEFloat local_60;
  IEEEFloat local_48;
  
  oVar3 = modSpecials(this,rhs);
  bVar1 = this->field_0x12;
  if (((bVar1 & 7) != 3 && (bVar1 & 6) != 0) &&
     ((rhs->field_0x12 & 7) != 3 && (rhs->field_0x12 & 6) != 0)) {
    oVar2 = oVar3;
    while( true ) {
      oVar3 = oVar2;
      cVar4 = compareAbsoluteValue(this,rhs);
      if (cVar4 == cmpLessThan) break;
      IEEEFloat(&local_48,rhs);
      ilogb(__x);
      ilogb(__x_00);
      scalbn(__x_01,(int)&local_90);
      ~IEEEFloat(&local_48);
      cVar4 = compareAbsoluteValue(this,&local_90);
      if (cVar4 == cmpLessThan) {
        IEEEFloat(&local_78,&local_90);
        scalbn(__x_02,(int)&local_60);
        operator=(&local_90,&local_60);
        ~IEEEFloat(&local_60);
        ~IEEEFloat(&local_78);
      }
      local_90._18_1_ = local_90._18_1_ & 0xf7 | this->field_0x12 & 8;
      oVar3 = addOrSubtract(this,&local_90,rmNearestTiesToEven,true);
      if (oVar3 != opOK) {
        __assert_fail("fs==opOK",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6df,"IEEEFloat::opStatus llvm::detail::IEEEFloat::mod(const IEEEFloat &)");
      }
      ~IEEEFloat(&local_90);
      oVar3 = opOK;
      if (((this->field_0x12 & 6) == 0) || ((this->field_0x12 & 7) == 3)) break;
      oVar3 = opOK;
      if (((rhs->field_0x12 & 6) == 0) || (oVar2 = opOK, (rhs->field_0x12 & 7) == 3)) break;
    }
  }
  if ((this->field_0x12 & 7) == 3) {
    this->field_0x12 = this->field_0x12 & 0xf3 | bVar1 & 8;
  }
  return oVar3;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::mod(const IEEEFloat &rhs) {
  opStatus fs;
  fs = modSpecials(rhs);
  unsigned int origSign = sign;

  while (isFiniteNonZero() && rhs.isFiniteNonZero() &&
         compareAbsoluteValue(rhs) != cmpLessThan) {
    IEEEFloat V = scalbn(rhs, ilogb(*this) - ilogb(rhs), rmNearestTiesToEven);
    if (compareAbsoluteValue(V) == cmpLessThan)
      V = scalbn(V, -1, rmNearestTiesToEven);
    V.sign = sign;

    fs = subtract(V, rmNearestTiesToEven);
    assert(fs==opOK);
  }
  if (isZero())
    sign = origSign; // fmod requires this
  return fs;
}